

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

Ops * __thiscall
miniscript::Node<unsigned_int>::CalcOps(Ops *__return_storage_ptr__,Node<unsigned_int> *this)

{
  char cVar1;
  uint32_t uVar2;
  pointer psVar3;
  element_type *peVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  pointer pMVar8;
  pointer pMVar9;
  MaxInt<unsigned_int> MVar10;
  ulong uVar11;
  element_type *peVar12;
  MaxInt<unsigned_int> MVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  MaxInt<unsigned_int> MVar18;
  element_type *peVar19;
  pointer psVar20;
  int iVar21;
  MaxInt<unsigned_int> MVar22;
  MaxInt<unsigned_int> MVar23;
  MaxInt<unsigned_int> MVar24;
  MaxInt<unsigned_int> MVar25;
  MaxInt<unsigned_int> MVar26;
  MaxInt<unsigned_int> MVar27;
  uint32_t uVar28;
  long in_FS_OFFSET;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  ret;
  MaxInt<unsigned_int> local_80;
  MaxInt<unsigned_int> local_78;
  pointer pMStack_70;
  pointer local_68;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    __return_storage_ptr__->count = 0;
    (__return_storage_ptr__->sat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    goto LAB_007303ca;
  case JUST_1:
    __return_storage_ptr__->count = 0;
    goto LAB_00730326;
  case PK_K:
    __return_storage_ptr__->count = 0;
    goto LAB_0073046d;
  case PK_H:
    __return_storage_ptr__->count = 3;
    goto LAB_0073046d;
  case OLDER:
  case AFTER:
    __return_storage_ptr__->count = 1;
    goto LAB_00730326;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    __return_storage_ptr__->count = 4;
LAB_00730326:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    break;
  case WRAP_A:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 2;
    goto LAB_00730164;
  case WRAP_S:
  case WRAP_C:
  case WRAP_N:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 1;
LAB_00730164:
    MVar10 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
    MVar25 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc);
    __return_storage_ptr__->count = uVar28;
    __return_storage_ptr__->sat = MVar10;
    __return_storage_ptr__->dsat = MVar25;
    goto LAB_0073060b;
  case WRAP_D:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 3;
    goto LAB_007303c0;
  case WRAP_V:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    MVar10 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
    __return_storage_ptr__->count =
         (peVar12->ops).count + (uint)(((peVar12->typ).m_flags >> 0xd & 1) != 0);
    __return_storage_ptr__->sat = MVar10;
    break;
  case WRAP_J:
    peVar12 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar28 = (peVar12->ops).count + 4;
LAB_007303c0:
    MVar10 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
    __return_storage_ptr__->count = uVar28;
    __return_storage_ptr__->sat = MVar10;
LAB_007303ca:
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).value = 0;
    goto LAB_0073060b;
  case AND_V:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar20->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true)) {
      uVar11 = (ulong)(*(uint *)((long)&peVar4->ops + 8) + *(uint *)((long)&peVar12->ops + 8)) <<
               0x20;
      uVar16 = 1;
    }
    else {
      uVar11 = 0;
      uVar16 = 0;
    }
    __return_storage_ptr__->count = (peVar4->ops).count + (peVar12->ops).count;
    __return_storage_ptr__->sat = (MaxInt<unsigned_int>)(uVar11 | uVar16);
    break;
  case AND_B:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar20->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar19 = psVar20[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar19->ops + 4))->valid == true)) {
      uVar11 = (ulong)(*(uint *)((long)&peVar19->ops + 8) + *(uint *)((long)&peVar12->ops + 8)) <<
               0x20;
      uVar16 = 1;
    }
    else {
      uVar11 = 0;
      uVar16 = 0;
    }
    MVar10 = (MaxInt<unsigned_int>)(uVar11 | uVar16);
    iVar21 = (peVar12->ops).count + (peVar19->ops).count;
    goto LAB_007305c0;
  case OR_B:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar20->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar19 = psVar20[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar14 = 0;
    uVar17 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true) {
      uVar17 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar19->ops + 0xc))->valid == true) {
        uVar17 = *(uint *)((long)&peVar19->ops + 0x10) + *(uint *)((long)&peVar12->ops + 8);
        bVar5 = true;
      }
    }
    bVar7 = false;
    if ((((MaxInt<unsigned_int> *)((long)&peVar19->ops + 4))->valid == true) &&
       (uVar14 = 0, ((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true)) {
      uVar14 = *(uint *)((long)&peVar12->ops + 0x10) + *(uint *)((long)&peVar19->ops + 8);
      bVar7 = true;
    }
    bVar6 = bVar7;
    uVar15 = uVar14;
    if ((bVar5) && (bVar6 = bVar5, uVar15 = uVar17, bVar7 != false)) {
      if (uVar14 < uVar17) {
        uVar14 = uVar17;
      }
      bVar6 = true;
      uVar15 = uVar14;
    }
    iVar21 = (peVar12->ops).count + (peVar19->ops).count;
    MVar10 = (MaxInt<unsigned_int>)((ulong)uVar15 << 0x20 | (ulong)bVar6);
LAB_007305c0:
    uVar28 = iVar21 + 1;
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) {
LAB_007305e3:
      if (((MaxInt<unsigned_int> *)((long)&peVar19->ops + 0xc))->valid != true) goto LAB_007305fa;
      uVar16 = (ulong)(*(uint *)((long)&peVar19->ops + 0x10) + *(uint *)((long)&peVar12->ops + 0x10)
                      ) << 0x20;
      uVar11 = 1;
    }
    else {
LAB_007305fa:
      uVar16 = 0;
      uVar11 = 0;
    }
    __return_storage_ptr__->count = uVar28;
    __return_storage_ptr__->sat = MVar10;
    __return_storage_ptr__->dsat = (MaxInt<unsigned_int>)(uVar16 | uVar11);
    goto LAB_0073060b;
  case OR_C:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar20->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar11 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar11 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) {
        uVar11 = (ulong)(*(uint *)((long)&peVar12->ops + 0x10) + *(uint *)((long)&peVar4->ops + 8));
        bVar5 = true;
      }
    }
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == false) {
      MVar18._1_7_ = 0;
      MVar18.valid = bVar5;
      MVar23 = MVar18;
    }
    else if (bVar5) {
      uVar14 = *(uint *)((long)&peVar12->ops + 8);
      if ((uint)uVar11 < uVar14) {
        uVar11 = (ulong)uVar14;
      }
      MVar23.valid = true;
      MVar23._1_3_ = 0;
      MVar23.value = 0;
      MVar18.valid = false;
      MVar18._1_3_ = 0;
      MVar18.value = 0;
    }
    else {
      MVar18 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
      uVar11 = (ulong)MVar18 >> 0x20;
      MVar23 = (MaxInt<unsigned_int>)((ulong)MVar18 & 0xff);
    }
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 2;
    __return_storage_ptr__->sat =
         (MaxInt<unsigned_int>)((ulong)(MVar18._0_4_ & 0xffffff00) | uVar11 << 0x20 | (ulong)MVar23)
    ;
    break;
  case OR_D:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar20->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar11 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar11 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) {
        uVar11 = (ulong)(*(uint *)((long)&peVar12->ops + 0x10) + *(uint *)((long)&peVar4->ops + 8));
        bVar5 = true;
      }
    }
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == false) {
      MVar22._1_7_ = 0;
      MVar22.valid = bVar5;
      MVar24 = MVar22;
    }
    else if (bVar5) {
      uVar14 = *(uint *)((long)&peVar12->ops + 8);
      if ((uint)uVar11 < uVar14) {
        uVar11 = (ulong)uVar14;
      }
      MVar24.valid = true;
      MVar24._1_3_ = 0;
      MVar24.value = 0;
      MVar22.valid = false;
      MVar22._1_3_ = 0;
      MVar22.value = 0;
    }
    else {
      MVar22 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
      uVar11 = (ulong)MVar22 >> 0x20;
      MVar24 = (MaxInt<unsigned_int>)((ulong)MVar22 & 0xff);
    }
    MVar24 = (MaxInt<unsigned_int>)
             ((ulong)(MVar22._0_4_ & 0xffffff00) | uVar11 << 0x20 | (ulong)MVar24);
    if ((((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == true)) {
      uVar16 = (ulong)(*(uint *)((long)&peVar4->ops + 0x10) + *(uint *)((long)&peVar12->ops + 0x10))
               << 0x20;
      uVar11 = 1;
    }
    else {
      uVar16 = 0;
      uVar11 = 0;
    }
    MVar10 = (MaxInt<unsigned_int>)(uVar16 | uVar11);
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 3;
    goto LAB_007305a0;
  case OR_I:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar20->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == false) {
      MVar25 = *(MaxInt<unsigned_int> *)((long)&peVar4->ops + 4);
LAB_00730534:
      uVar11 = (ulong)MVar25 >> 0x20;
      MVar27 = MVar25;
    }
    else {
      if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == false) {
        MVar25 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 4);
        goto LAB_00730534;
      }
      uVar14 = *(uint *)((long)&peVar12->ops + 8);
      uVar17 = *(uint *)((long)&peVar4->ops + 8);
      if (uVar17 < uVar14) {
        uVar17 = uVar14;
      }
      uVar11 = (ulong)uVar17;
      MVar27.valid = true;
      MVar27._1_3_ = 0;
      MVar27.value = 0;
      MVar25.valid = false;
      MVar25._1_3_ = 0;
      MVar25.value = 0;
    }
    MVar24 = (MaxInt<unsigned_int>)
             ((ulong)MVar27 & 0xff | (ulong)(MVar25._0_4_ & 0xffffff00) | uVar11 << 0x20);
    if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid == false) {
      MVar13 = *(MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc);
LAB_00730581:
      uVar11 = (ulong)MVar13 >> 0x20;
      MVar26 = MVar13;
    }
    else {
      if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 0xc))->valid == false) {
        MVar13 = *(MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc);
        goto LAB_00730581;
      }
      uVar14 = *(uint *)((long)&peVar12->ops + 0x10);
      uVar17 = *(uint *)((long)&peVar4->ops + 0x10);
      if (uVar17 < uVar14) {
        uVar17 = uVar14;
      }
      uVar11 = (ulong)uVar17;
      MVar26.valid = true;
      MVar26._1_3_ = 0;
      MVar26.value = 0;
      MVar13.valid = false;
      MVar13._1_3_ = 0;
      MVar13.value = 0;
    }
    MVar10 = (MaxInt<unsigned_int>)
             ((ulong)MVar26 & 0xff | (ulong)(MVar13._0_4_ & 0xffffff00) | uVar11 << 0x20);
    __return_storage_ptr__->count = (peVar12->ops).count + (peVar4->ops).count + 3;
LAB_007305a0:
    __return_storage_ptr__->sat = MVar24;
    __return_storage_ptr__->dsat = MVar10;
    goto LAB_0073060b;
  case ANDOR:
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar12 = (psVar20->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar4 = psVar20[1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar19 = psVar20[2].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar14 = 0;
    uVar17 = 0;
    bVar5 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar4->ops + 4))->valid == true) {
      uVar17 = 0;
      bVar5 = false;
      if (((MaxInt<unsigned_int> *)((long)&peVar12->ops + 4))->valid == true) {
        uVar17 = *(uint *)((long)&peVar12->ops + 8) + *(uint *)((long)&peVar4->ops + 8);
        bVar5 = true;
      }
    }
    cVar1 = ((MaxInt<unsigned_int> *)((long)&peVar12->ops + 0xc))->valid;
    bVar7 = false;
    if ((cVar1 == '\x01') &&
       (uVar14 = 0, ((MaxInt<unsigned_int> *)((long)&peVar19->ops + 4))->valid == true)) {
      uVar14 = *(uint *)((long)&peVar19->ops + 8) + *(uint *)((long)&peVar12->ops + 0x10);
      bVar7 = true;
    }
    bVar6 = bVar7;
    uVar15 = uVar14;
    if ((bVar5) && (bVar6 = bVar5, uVar15 = uVar17, bVar7 != false)) {
      if (uVar14 < uVar17) {
        uVar14 = uVar17;
      }
      bVar6 = true;
      uVar15 = uVar14;
    }
    uVar28 = (peVar12->ops).count + (peVar4->ops).count + (peVar19->ops).count + 3;
    MVar10 = (MaxInt<unsigned_int>)((ulong)uVar15 << 0x20 | (ulong)bVar6);
    if (cVar1 != '\0') goto LAB_007305e3;
    goto LAB_007305fa;
  case THRESH:
    local_78.valid = true;
    local_78 = (MaxInt<unsigned_int>)((ulong)local_78 & 0xffffffff);
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::reserve(&local_58,1);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
    ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
              ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                *)&local_58,&local_78);
    psVar20 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar28 = 0;
    if (psVar20 != psVar3) {
      do {
        if (((local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->valid == '\x01') &&
           (peVar12 = (psVar20->
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr, (peVar12->ops).dsat.valid == true)) {
          uVar11 = (ulong)((peVar12->ops).dsat.value +
                          *(uint *)((long)local_58.
                                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4)) << 0x20;
          uVar16 = 1;
        }
        else {
          uVar11 = 0;
          uVar16 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar11 | uVar16);
        uVar2 = (((psVar20->
                  super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->ops).count;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::reserve((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)&local_78,1);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        uVar11 = (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (8 < uVar11) {
          uVar16 = 1;
          do {
            peVar12 = (psVar20->
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            uVar14 = 0;
            uVar17 = 0;
            bVar5 = false;
            if (((MaxInt<unsigned_int> *)
                ((long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16 * 8))->valid == true) {
              uVar17 = 0;
              bVar5 = false;
              if ((peVar12->ops).dsat.valid == true) {
                uVar17 = (peVar12->ops).dsat.value +
                         ((uint *)((long)local_58.
                                         super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4))[uVar16 * 2]
                ;
                bVar5 = true;
              }
            }
            bVar7 = false;
            if ((((MaxInt<unsigned_int> *)
                 ((long)local_58.
                        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + -8))[uVar16].valid == true) &&
               (uVar14 = 0, (peVar12->ops).sat.valid == true)) {
              uVar14 = (peVar12->ops).sat.value +
                       ((uint *)((long)local_58.
                                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + -4))[uVar16 * 2];
              bVar7 = true;
            }
            bVar6 = bVar7;
            uVar15 = uVar14;
            if ((bVar5) && (bVar6 = bVar5, uVar15 = uVar17, bVar7 != false)) {
              if (uVar14 < uVar17) {
                uVar14 = uVar17;
              }
              bVar6 = true;
              uVar15 = uVar14;
            }
            local_80 = (MaxInt<unsigned_int>)((ulong)uVar15 << 0x20 | (ulong)bVar6);
            std::
            vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
            ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                      ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                        *)&local_78,&local_80);
            uVar16 = uVar16 + 1;
            uVar11 = (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar16 < (ulong)((long)uVar11 >> 3));
        }
        if (((&((MaxInt<unsigned_int> *)
               ((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -8))->valid)[uVar11] == true) &&
           (peVar12 = (psVar20->
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr, (peVar12->ops).sat.valid == true)) {
          uVar16 = (ulong)((peVar12->ops).sat.value +
                          *(int *)((long)((long)local_58.
                                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + -4) +
                                  uVar11)) << 0x20;
          uVar11 = 1;
        }
        else {
          uVar16 = 0;
          uVar11 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar16 | uVar11);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        pMVar9 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar8 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pMStack_70;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        if ((MaxInt<unsigned_int>)pMVar8 != (MaxInt<unsigned_int>)0x0) {
          operator_delete(pMVar8,(long)pMVar9 - (long)pMVar8);
        }
        if (local_78 != (MaxInt<unsigned_int>)0x0) {
          operator_delete((void *)local_78,(long)local_68 - (long)local_78);
        }
        uVar28 = uVar28 + uVar2 + 1;
        psVar20 = psVar20 + 1;
      } while (psVar20 != psVar3);
    }
    if ((ulong)((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0x3db,
                    "internal::Ops miniscript::Node<unsigned int>::CalcOps() const [Key = unsigned int]"
                   );
    }
    MVar10 = *(MaxInt<unsigned_int> *)
              ((long)local_58.
                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (ulong)this->k * 8);
    MVar25 = *local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->count = uVar28;
    __return_storage_ptr__->sat = MVar10;
    __return_storage_ptr__->dsat = MVar25;
    operator_delete(local_58.
                    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    goto LAB_0073060b;
  case MULTI:
    MVar10 = (MaxInt<unsigned_int>)
             (((long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) * 0x40000000 + 1);
    __return_storage_ptr__->count = 1;
    goto LAB_00730472;
  case MULTI_A:
    __return_storage_ptr__->count =
         (int)((ulong)((long)(this->keys).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->keys).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) + 1;
LAB_0073046d:
    MVar10.valid = true;
    MVar10._1_3_ = 0;
    MVar10.value = 0;
LAB_00730472:
    __return_storage_ptr__->sat = MVar10;
    __return_storage_ptr__->dsat = MVar10;
    goto LAB_0073060b;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x3df,
                  "internal::Ops miniscript::Node<unsigned int>::CalcOps() const [Key = unsigned int]"
                 );
  }
  (__return_storage_ptr__->dsat).valid = false;
  *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
  (__return_storage_ptr__->dsat).value = 0;
LAB_0073060b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

internal::Ops CalcOps() const {
        switch (fragment) {
            case Fragment::JUST_1: return {0, 0, {}};
            case Fragment::JUST_0: return {0, {}, 0};
            case Fragment::PK_K: return {0, 0, 0};
            case Fragment::PK_H: return {3, 0, 0};
            case Fragment::OLDER:
            case Fragment::AFTER: return {1, 0, {}};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {4, 0, {}};
            case Fragment::AND_V: return {subs[0]->ops.count + subs[1]->ops.count, subs[0]->ops.sat + subs[1]->ops.sat, {}};
            case Fragment::AND_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat + subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{(subs[0]->ops.sat + subs[1]->ops.dsat) | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_D: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_C: {
                const auto count{2 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                return {count, sat, {}};
            }
            case Fragment::OR_I: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat | subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::ANDOR: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count + subs[2]->ops.count};
                const auto sat{(subs[1]->ops.sat + subs[0]->ops.sat) | (subs[0]->ops.dsat + subs[2]->ops.sat)};
                const auto dsat{subs[0]->ops.dsat + subs[2]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::MULTI: return {1, (uint32_t)keys.size(), (uint32_t)keys.size()};
            case Fragment::MULTI_A: return {(uint32_t)keys.size() + 1, 0, 0};
            case Fragment::WRAP_S:
            case Fragment::WRAP_C:
            case Fragment::WRAP_N: return {1 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_A: return {2 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_D: return {3 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_J: return {4 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_V: return {subs[0]->ops.count + (subs[0]->GetType() << "x"_mst), subs[0]->ops.sat, {}};
            case Fragment::THRESH: {
                uint32_t count = 0;
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    count += sub->ops.count + 1;
                    auto next_sats = Vector(sats[0] + sub->ops.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ops.dsat) | (sats[j - 1] + sub->ops.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ops.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {count, sats[k], sats[0]};
            }
        }
        assert(false);
    }